

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2TestPackage.cpp
# Opt level: O2

void __thiscall deqp::gles2::TestPackage::~TestPackage(TestPackage *this)

{
  Context *this_00;
  
  (this->super_TestPackage).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestPackage_0070ffb0
  ;
  tcu::TestNode::deinit((TestNode *)this);
  this_00 = this->m_context;
  if (this_00 != (Context *)0x0) {
    Context::~Context(this_00);
  }
  operator_delete(this_00,0x18);
  tcu::ResourcePrefix::~ResourcePrefix(&this->m_archive);
  tcu::TestPackage::~TestPackage(&this->super_TestPackage);
  return;
}

Assistant:

TestPackage::~TestPackage (void)
{
	// Destroy children first since destructors may access context.
	TestNode::deinit();
	delete m_context;
}